

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18f9de::CBBTest_StickyError_Test::TestBody(CBBTest_StickyError_Test *this)

{
  int iVar1;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  AssertionResult gtest_ar_;
  uint8_t *ptr;
  size_t len;
  uint8_t buf;
  ScopedCBB cbb;
  CBB child;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  internal local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  AssertHelper local_b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  string local_a0;
  AssertHelper local_80;
  uint8_t local_71;
  CBB local_70;
  CBB local_40;
  
  CBB_zero(&local_70);
  iVar1 = CBB_init(&local_70,0);
  local_c0[0] = (internal)(iVar1 != 0);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,local_c0,(AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4c0,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a8);
LAB_00223e04:
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    local_c8._M_head_impl = local_a8._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      local_c8._M_head_impl = local_a8._M_head_impl;
    }
  }
  else {
    iVar1 = CBB_add_u8_length_prefixed(&local_70,&local_40);
    local_c0[0] = (internal)(iVar1 != 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,local_c0,
                 (AssertionResult *)"CBB_add_u8_length_prefixed(cbb.get(), &child)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c1,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a8);
      goto LAB_00223e04;
    }
    iVar1 = CBB_add_bytes(&local_40,"",0x100);
    local_c0[0] = (internal)(iVar1 != 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,local_c0,
                 (AssertionResult *)"CBB_add_bytes(&child, kZeros, sizeof(kZeros))","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c2,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a8);
      goto LAB_00223e04;
    }
    iVar1 = CBB_flush(&local_70);
    local_c0[0] = (internal)(iVar1 == 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c0[0]) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,local_c0,(AssertionResult *)"CBB_flush(cbb.get())","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c3,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a8);
      goto LAB_00223e04;
    }
    iVar1 = CBB_add_u8(&local_70,'\0');
    local_c0[0] = (internal)(iVar1 == 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c0[0]) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,local_c0,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c8,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
    iVar1 = CBB_finish(&local_70,(uint8_t **)&local_a8,(size_t *)&local_80);
    local_c0[0] = (internal)(iVar1 == 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c0[0]) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,local_c0,(AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c9,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
    CBB_cleanup(&local_70);
    CBB_zero(&local_70);
    iVar1 = CBB_init_fixed(&local_70,&local_71,1);
    local_c0[0] = (internal)(iVar1 != 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,local_c0,(AssertionResult *)"CBB_init_fixed(cbb.get(), &buf, 1)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4ce,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
    }
    else {
      iVar1 = CBB_add_bytes(&local_70,"",0x100);
      local_c0[0] = (internal)(iVar1 == 0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_c0[0]) {
        iVar1 = CBB_add_u8(&local_70,'\0');
        local_c0[0] = (internal)(iVar1 == 0);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_c0[0]) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a0,local_c0,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d2,local_a0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,local_b8);
        }
        iVar1 = CBB_finish(&local_70,(uint8_t **)&local_a8,(size_t *)&local_80);
        local_c0[0] = (internal)(iVar1 == 0);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_c0[0]) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a0,local_c0,(AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d3,local_a0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,local_b8);
        }
        CBB_cleanup(&local_70);
        CBB_zero(&local_70);
        iVar1 = CBB_init(&local_70,0);
        local_c0[0] = (internal)(iVar1 != 0);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a0,local_c0,(AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d7,local_a0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
        }
        else {
          iVar1 = CBB_add_u24(&local_70,0x1000000);
          local_c0[0] = (internal)(iVar1 == 0);
          local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_c0[0]) {
            iVar1 = CBB_add_u8(&local_70,'\0');
            local_c0[0] = (internal)(iVar1 == 0);
            local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_c0[0]) {
              testing::Message::Message((Message *)&local_c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_a0,local_c0,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true",
                         "false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x4db,local_a0._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_c8._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_c8._M_head_impl + 8))();
              }
            }
            if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_b8,local_b8);
            }
            iVar1 = CBB_finish(&local_70,(uint8_t **)&local_a8,(size_t *)&local_80);
            local_c0[0] = (internal)(iVar1 == 0);
            local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_c0[0]) goto LAB_00223e39;
            testing::Message::Message((Message *)&local_c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,local_c0,(AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4dc,local_a0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          }
          else {
            testing::Message::Message((Message *)&local_c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,local_c0,(AssertionResult *)"CBB_add_u24(cbb.get(), 1u << 24)",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4d8,local_a0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a0,local_c0,
                   (AssertionResult *)"CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros))","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x4cf,local_a0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_c8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_c8._M_head_impl + 8))();
  }
LAB_00223e39:
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  CBB_cleanup(&local_70);
  return;
}

Assistant:

TEST(CBBTest, StickyError) {
  // Write an input that exceeds the limit for its length prefix.
  bssl::ScopedCBB cbb;
  CBB child;
  static const uint8_t kZeros[256] = {0};
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_TRUE(CBB_add_u8_length_prefixed(cbb.get(), &child));
  ASSERT_TRUE(CBB_add_bytes(&child, kZeros, sizeof(kZeros)));
  ASSERT_FALSE(CBB_flush(cbb.get()));

  // All future operations should fail.
  uint8_t *ptr;
  size_t len;
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write an input that cannot fit in a fixed CBB.
  cbb.Reset();
  uint8_t buf;
  ASSERT_TRUE(CBB_init_fixed(cbb.get(), &buf, 1));
  ASSERT_FALSE(CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros)));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write a u32 that cannot fit in a u24.
  cbb.Reset();
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_FALSE(CBB_add_u24(cbb.get(), 1u << 24));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));
}